

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Cex.c
# Opt level: O2

Vec_Ptr_t * Llb4_Nonlin4VerifyCex(Aig_Man_t *pAig,Abc_Cex_t *p)

{
  undefined1 *puVar1;
  uint *puVar2;
  ulong uVar3;
  void **__ptr;
  ulong uVar4;
  Vec_Ptr_t *p_00;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  int i;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  
  iVar11 = p->iFrame;
  uVar3 = (long)iVar11 + 1;
  iVar9 = ((pAig->nRegs >> 5) + 1) - (uint)((pAig->nRegs & 0x1fU) == 0);
  __ptr = (void **)malloc(((long)iVar9 * 4 + 8) * uVar3);
  uVar4 = 0;
  iVar10 = (int)uVar3;
  uVar7 = 0;
  if (0 < iVar10) {
    uVar7 = uVar3 & 0xffffffff;
  }
  lVar8 = (long)iVar11 * 8 + 8;
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    __ptr[uVar4] = (void *)((long)__ptr + lVar8);
    lVar8 = lVar8 + (long)iVar9 * 4;
  }
  p_00 = (Vec_Ptr_t *)malloc(0x10);
  p_00->nSize = iVar10;
  p_00->nCap = iVar10;
  p_00->pArray = __ptr;
  for (iVar10 = 0; iVar10 <= iVar11; iVar10 = iVar10 + 1) {
    pvVar5 = Vec_PtrEntry(p_00,iVar10);
    memset(pvVar5,0,(long)(iVar9 * 4));
  }
  Aig_ManCleanMarkB(pAig);
  puVar1 = &pAig->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  for (iVar11 = 0; iVar9 = pAig->nRegs, iVar11 < iVar9; iVar11 = iVar11 + 1) {
    pvVar5 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar11);
    *(byte *)((long)pvVar5 + 0x18) = *(byte *)((long)pvVar5 + 0x18) & 0xdf;
  }
  iVar11 = p->nRegs;
  for (iVar10 = 0; iVar10 <= p->iFrame; iVar10 = iVar10 + 1) {
    for (uVar14 = 0; (int)uVar14 < iVar9; uVar14 = uVar14 + 1) {
      pvVar5 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + uVar14);
      if ((*(byte *)((long)pvVar5 + 0x18) & 0x20) != 0) {
        pvVar5 = Vec_PtrEntry(p_00,iVar10);
        puVar2 = (uint *)((long)pvVar5 + (ulong)(uVar14 >> 5) * 4);
        *puVar2 = *puVar2 | 1 << ((byte)uVar14 & 0x1f);
      }
      iVar9 = pAig->nRegs;
    }
    for (iVar9 = 0; iVar13 = iVar9 + iVar11, iVar9 < pAig->nTruePis; iVar9 = iVar9 + 1) {
      pvVar5 = Vec_PtrEntry(pAig->vCis,iVar9);
      *(ulong *)((long)pvVar5 + 0x18) =
           *(ulong *)((long)pvVar5 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((uint)(&p[1].iPo)[iVar13 >> 5] >> ((byte)iVar13 & 0x1f) & 1) << 5);
    }
    for (iVar12 = 0; iVar12 < pAig->vObjs->nSize; iVar12 = iVar12 + 1) {
      pvVar5 = Vec_PtrEntry(pAig->vObjs,iVar12);
      if ((pvVar5 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar5 + 0x18) & 7) - 7))
      {
        *(ulong *)((long)pvVar5 + 0x18) =
             *(ulong *)((long)pvVar5 + 0x18) & 0xffffffffffffffdf |
             (ulong)((((uint)*(ulong *)((long)pvVar5 + 0x10) ^
                      *(uint *)((*(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 5)
                      & ((uint)*(ulong *)((long)pvVar5 + 8) ^
                        *(uint *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x18) >> 5)
                     & 1) << 5);
      }
    }
    for (iVar12 = 0; iVar12 < pAig->vCos->nSize; iVar12 = iVar12 + 1) {
      pvVar5 = Vec_PtrEntry(pAig->vCos,iVar12);
      *(ulong *)((long)pvVar5 + 0x18) =
           *(ulong *)((long)pvVar5 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((int)*(ulong *)((long)pvVar5 + 8) << 5 ^
                   *(uint *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20);
    }
    if (iVar10 == p->iFrame) {
      iVar11 = iVar11 + iVar9;
      break;
    }
    for (iVar11 = 0; iVar9 = pAig->nRegs, iVar11 < iVar9; iVar11 = iVar11 + 1) {
      pvVar5 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar11);
      pvVar6 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar11);
      *(ulong *)((long)pvVar6 + 0x18) =
           *(ulong *)((long)pvVar6 + 0x18) & 0xffffffffffffffdf |
           (ulong)((uint)*(undefined8 *)((long)pvVar5 + 0x18) & 0x20);
    }
    iVar11 = iVar13;
  }
  if (iVar11 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Cex.c"
                  ,0xfb,"Vec_Ptr_t *Llb4_Nonlin4VerifyCex(Aig_Man_t *, Abc_Cex_t *)");
  }
  iVar11 = pAig->nTruePos;
  do {
    if (iVar11 < 1) {
      if (iVar11 == 0) {
        free(__ptr);
        free(p_00);
        p_00 = (Vec_Ptr_t *)0x0;
      }
      goto LAB_0068fe08;
    }
    iVar11 = iVar11 + -1;
    pvVar5 = Vec_PtrEntry(pAig->vCos,iVar11);
  } while ((*(byte *)((long)pvVar5 + 0x18) & 0x20) == 0);
  p->iPo = iVar11;
LAB_0068fe08:
  Aig_ManCleanMarkB(pAig);
  return p_00;
}

Assistant:

Vec_Ptr_t * Llb4_Nonlin4VerifyCex( Aig_Man_t * pAig, Abc_Cex_t * p )
{
    Vec_Ptr_t * vStates;
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, k, iBit = 0;
    // create storage for states
    vStates = Vec_PtrAllocSimInfo( p->iFrame+1, Abc_BitWordNum(Aig_ManRegNum(pAig)) );
    Vec_PtrCleanSimInfo( vStates, 0, Abc_BitWordNum(Aig_ManRegNum(pAig)) );
    // verify counter-example
    Aig_ManCleanMarkB(pAig);
    Aig_ManConst1(pAig)->fMarkB = 1;
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->fMarkB = 0; //Abc_InfoHasBit(p->pData, iBit++);
    // do not require equal flop count in the AIG and in the CEX
    iBit = p->nRegs;
    for ( i = 0; i <= p->iFrame; i++ )
    {
        // save current state
        Saig_ManForEachLo( pAig, pObj, k )
            if ( pObj->fMarkB )
                Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(vStates, i), k );
        // compute new state
        Saig_ManForEachPi( pAig, pObj, k )
            pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
        Aig_ManForEachNode( pAig, pObj, k )
            pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                           (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
        Aig_ManForEachCo( pAig, pObj, k )
            pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
/*
    {
        unsigned * pNext;
        Vec_PtrForEachEntry( unsigned *, vStates, pNext, i )
        {
            printf( "%4d : ", i );
            Extra_PrintBinary( stdout, pNext, Aig_ManRegNum(pAig) );
            printf( "\n" );
        }
    }
*/
    assert( iBit == p->nBits );
//    if ( Aig_ManCo(pAig, p->iPo)->fMarkB == 0 )
//        Vec_PtrFreeP( &vStates );
    for ( i = Saig_ManPoNum(pAig) - 1; i >= 0; i-- )
    {
        if ( Aig_ManCo(pAig, i)->fMarkB )
        {
            p->iPo = i;
            break;
        }
    }
    if ( i == -1 )
        Vec_PtrFreeP( &vStates );
    Aig_ManCleanMarkB(pAig);
    return vStates;
}